

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitStringEncode(BinaryInstWriter *this,StringEncode *curr)

{
  bool bVar1;
  U32LEB x;
  BufferWithRandomAccess *this_00;
  
  bVar1 = wasm::Type::isNull(&curr->str->type);
  if (bVar1) {
    emitUnreachable(this);
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,-5);
  if (curr->op == StringEncodeWTF16Array) {
    this_00 = this->o;
    x.value = 0xb3;
  }
  else {
    if (curr->op != StringEncodeLossyUTF8Array) {
      handle_unreachable("invalid string.new*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa20);
    }
    this_00 = this->o;
    x.value = 0xb6;
  }
  BufferWithRandomAccess::operator<<(this_00,x);
  return;
}

Assistant:

void BinaryInstWriter::visitStringEncode(StringEncode* curr) {
  if (curr->str->type.isNull()) {
    // See visitStringNew.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEncodeLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringEncodeLossyUTF8Array);
      break;
    case StringEncodeWTF16Array:
      o << U32LEB(BinaryConsts::StringEncodeWTF16Array);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}